

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rollercoster.cpp
# Opt level: O1

bool convert(char *c,bool *upper)

{
  byte bVar1;
  
  bVar1 = *c;
  if (*upper == false) {
    if (0x19 < (byte)(bVar1 + 0xbf)) {
      bVar1 = bVar1 + 0x9f;
      goto LAB_00101236;
    }
    bVar1 = bVar1 | 0x20;
  }
  else {
    if (0x19 < (byte)(bVar1 + 0x9f)) {
      bVar1 = bVar1 + 0xbf;
LAB_00101236:
      if (bVar1 < 0x1a) {
        return true;
      }
      return false;
    }
    bVar1 = bVar1 - 0x20;
  }
  *c = bVar1;
  return true;
}

Assistant:

bool convert( char& c, bool& upper){
    if(!upper) {
        if (c <= 'Z' && c >= 'A') {
            c = c - ('Z' - 'z');
            return true;
        } else if(c <= 'z' && c >= 'a'){
            return true;
        }
    } else {
        if (upper && c <= 'z' && c >= 'a') {
            c = c + ('Z' - 'z');
            return true;
        } else if (c <= 'Z' && c >= 'A'){
            return true;
        }
    }
    return false;
}